

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O2

int knownhost_add(LIBSSH2_KNOWNHOSTS *hosts,char *host,char *salt,char *key_type_name,
                 size_t key_type_len,char *key,size_t keylen,char *comment,size_t commentlen,
                 int typemask,libssh2_knownhost **store)

{
  size_t __n;
  libssh2_knownhost **pplVar1;
  int iVar2;
  size_t sVar3;
  known_host *entry;
  char *pcVar4;
  size_t sVar5;
  libssh2_knownhost *plVar6;
  LIBSSH2_SESSION *pLVar7;
  long lStack_90;
  char *ptr;
  char *local_70;
  size_t ptrlen;
  char *local_60;
  size_t local_58;
  char *local_50;
  size_t local_48;
  libssh2_knownhost **local_40;
  size_t local_38;
  
  local_40 = store;
  local_58 = commentlen;
  local_60 = comment;
  local_38 = keylen;
  local_70 = key;
  local_50 = key_type_name;
  local_48 = key_type_len;
  sVar3 = strlen(host);
  pLVar7 = hosts->session;
  if ((typemask & 0x3c0000U) == 0) {
    pcVar4 = "No key type set";
    lStack_90._0_4_ = -0x22;
LAB_00114c3b:
    iVar2 = _libssh2_error(pLVar7,(int)lStack_90,pcVar4);
    return iVar2;
  }
  entry = (known_host *)_libssh2_calloc(pLVar7,0x90);
  if (entry == (known_host *)0x0) {
    pLVar7 = hosts->session;
    pcVar4 = "Unable to allocate memory for known host entry";
    lStack_90._0_4_ = -6;
    goto LAB_00114c3b;
  }
  entry->typemask = typemask;
  if ((short)typemask == 3) {
LAB_00114ba7:
    pcVar4 = (char *)(*hosts->session->alloc)(sVar3 + 1,&hosts->session->abstract);
    entry->name = pcVar4;
    if (pcVar4 == (char *)0x0) {
      pLVar7 = hosts->session;
      pcVar4 = "Unable to allocate memory for host name";
      iVar2 = -6;
LAB_00114ced:
      iVar2 = _libssh2_error(pLVar7,iVar2,pcVar4);
      goto LAB_00114e3e;
    }
    memcpy(pcVar4,host,sVar3 + 1);
    lStack_90 = 0x20;
    ptrlen = sVar3;
  }
  else {
    if ((typemask & 0xffffU) != 2) {
      if ((typemask & 0xffffU) == 1) goto LAB_00114ba7;
      pLVar7 = hosts->session;
      pcVar4 = "Unknown host name type";
      iVar2 = -0x21;
      goto LAB_00114ced;
    }
    iVar2 = _libssh2_base64_decode(hosts->session,&ptr,&ptrlen,host,sVar3);
    if (iVar2 != 0) goto LAB_00114e3e;
    if (salt == (char *)0x0) {
      pLVar7 = hosts->session;
      pcVar4 = "Salt is NULL";
      iVar2 = -0x22;
      goto LAB_00114ced;
    }
    entry->name = ptr;
    entry->name_len = ptrlen;
    pLVar7 = hosts->session;
    sVar3 = strlen(salt);
    iVar2 = _libssh2_base64_decode(pLVar7,&ptr,&ptrlen,salt,sVar3);
    if (iVar2 != 0) goto LAB_00114e3e;
    entry->salt = ptr;
    lStack_90 = 0x38;
  }
  *(size_t *)((long)&(entry->node).next + lStack_90) = ptrlen;
  if (((uint)typemask >> 0x11 & 1) == 0) {
    sVar5 = _libssh2_base64_encode(hosts->session,local_70,local_38,&ptr);
    if (sVar5 == 0) {
      pLVar7 = hosts->session;
      pcVar4 = "Unable to allocate memory for base64-encoded key";
    }
    else {
      entry->key = ptr;
LAB_00114d4a:
      __n = local_48;
      sVar5 = local_58;
      if ((typemask & 0x3c0000U) == 0x3c0000 && local_50 != (char *)0x0) {
        pcVar4 = (char *)(*hosts->session->alloc)(local_48 + 1,&hosts->session->abstract);
        entry->key_type_name = pcVar4;
        if (pcVar4 == (char *)0x0) {
          pLVar7 = hosts->session;
          pcVar4 = "Unable to allocate memory for key type";
          goto LAB_00114e33;
        }
        memcpy(pcVar4,local_50,__n);
        entry->key_type_name[__n] = '\0';
        entry->key_type_len = __n;
      }
      if (local_60 == (char *)0x0) {
        entry->comment = (char *)0x0;
LAB_00114ddc:
        _libssh2_list_add(&hosts->head,(list_node *)entry);
        pplVar1 = local_40;
        if (local_40 == (libssh2_knownhost **)0x0) {
          return 0;
        }
        plVar6 = knownhost_to_external(entry);
        *pplVar1 = plVar6;
        return 0;
      }
      pcVar4 = (char *)(*hosts->session->alloc)(sVar5 + 1,&hosts->session->abstract);
      entry->comment = pcVar4;
      if (pcVar4 != (char *)0x0) {
        memcpy(pcVar4,local_60,sVar5 + 1);
        entry->comment[sVar5] = '\0';
        entry->comment_len = sVar5;
        goto LAB_00114ddc;
      }
      pLVar7 = hosts->session;
      pcVar4 = "Unable to allocate memory for comment";
    }
  }
  else {
    sVar5 = local_38;
    if (local_38 == 0) {
      sVar5 = strlen(local_70);
    }
    pcVar4 = (char *)(*hosts->session->alloc)(sVar5 + 1,&hosts->session->abstract);
    entry->key = pcVar4;
    if (pcVar4 != (char *)0x0) {
      memcpy(pcVar4,local_70,sVar5 + 1);
      entry->key[sVar5] = '\0';
      goto LAB_00114d4a;
    }
    pLVar7 = hosts->session;
    pcVar4 = "Unable to allocate memory for key";
  }
LAB_00114e33:
  iVar2 = _libssh2_error(pLVar7,-6,pcVar4);
LAB_00114e3e:
  free_host(hosts->session,entry);
  return iVar2;
}

Assistant:

static int
knownhost_add(LIBSSH2_KNOWNHOSTS *hosts,
              const char *host, const char *salt,
              const char *key_type_name, size_t key_type_len,
              const char *key, size_t keylen,
              const char *comment, size_t commentlen,
              int typemask, struct libssh2_knownhost **store)
{
    struct known_host *entry;
    size_t hostlen = strlen(host);
    int rc;
    char *ptr;
    size_t ptrlen;

    /* make sure we have a key type set */
    if(!(typemask & LIBSSH2_KNOWNHOST_KEY_MASK))
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_INVAL,
                              "No key type set");

    entry = LIBSSH2_CALLOC(hosts->session, sizeof(struct known_host));
    if(!entry)
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                              "Unable to allocate memory for known host "
                              "entry");

    entry->typemask = typemask;

    switch(entry->typemask  & LIBSSH2_KNOWNHOST_TYPE_MASK) {
    case LIBSSH2_KNOWNHOST_TYPE_PLAIN:
    case LIBSSH2_KNOWNHOST_TYPE_CUSTOM:
        entry->name = LIBSSH2_ALLOC(hosts->session, hostlen + 1);
        if(!entry->name) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for host name");
            goto error;
        }
        memcpy(entry->name, host, hostlen + 1);
        entry->name_len = hostlen;
        break;
    case LIBSSH2_KNOWNHOST_TYPE_SHA1:
        rc = _libssh2_base64_decode(hosts->session, &ptr, &ptrlen,
                                    host, hostlen);
        if(rc)
            goto error;

        if(!salt) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_INVAL,
                                "Salt is NULL");
            goto error;
        }

        entry->name = ptr;
        entry->name_len = ptrlen;

        rc = _libssh2_base64_decode(hosts->session, &ptr, &ptrlen,
                                    salt, strlen(salt));
        if(rc)
            goto error;
        entry->salt = ptr;
        entry->salt_len = ptrlen;
        break;
    default:
        rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                            "Unknown host name type");
        goto error;
    }

    if(typemask & LIBSSH2_KNOWNHOST_KEYENC_BASE64) {
        /* the provided key is base64 encoded already */
        if(!keylen)
            keylen = strlen(key);
        entry->key = LIBSSH2_ALLOC(hosts->session, keylen + 1);
        if(!entry->key) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for key");
            goto error;
        }
        memcpy(entry->key, key, keylen + 1);
        entry->key[keylen] = 0; /* force a terminating zero trailer */
    }
    else {
        /* key is raw, we base64 encode it and store it as such */
        size_t nlen = _libssh2_base64_encode(hosts->session, key, keylen,
                                             &ptr);
        if(!nlen) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for "
                                "base64-encoded key");
            goto error;
        }

        entry->key = ptr;
    }

    if(key_type_name && ((typemask & LIBSSH2_KNOWNHOST_KEY_MASK) ==
                          LIBSSH2_KNOWNHOST_KEY_UNKNOWN)) {
        entry->key_type_name = LIBSSH2_ALLOC(hosts->session, key_type_len + 1);
        if(!entry->key_type_name) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for key type");
            goto error;
        }
        memcpy(entry->key_type_name, key_type_name, key_type_len);
        entry->key_type_name[key_type_len] = 0;
        entry->key_type_len = key_type_len;
    }

    if(comment) {
        entry->comment = LIBSSH2_ALLOC(hosts->session, commentlen + 1);
        if(!entry->comment) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for comment");
            goto error;
        }
        memcpy(entry->comment, comment, commentlen + 1);
        entry->comment[commentlen] = 0; /* force a terminating zero trailer */
        entry->comment_len = commentlen;
    }
    else {
        entry->comment = NULL;
    }

    /* add this new host to the big list of known hosts */
    _libssh2_list_add(&hosts->head, &entry->node);

    if(store)
        *store = knownhost_to_external(entry);

    return LIBSSH2_ERROR_NONE;
error:
    free_host(hosts->session, entry);
    return rc;
}